

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

QString * __thiscall
QMessageBox::buttonText(QString *__return_storage_ptr__,QMessageBox *this,int button)

{
  QMessageBoxPrivate *this_00;
  QAbstractButton *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_01 = QMessageBoxPrivate::abstractButtonForId(this_00,button);
  if (this_01 == (QAbstractButton *)0x0) {
    QDialogButtonBox::buttons
              ((QList<QAbstractButton_*> *)&local_40,(QDialogButtonBox *)this_00->buttonBox);
    QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_40);
    if ((local_40.size == 0) && ((button == 0x400 || (button == 1)))) {
      QDialogButtonBox::tr(__return_storage_ptr__,"OK",(char *)0x0,-1);
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_004bb948;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_004bb948:
      __stack_chk_fail();
    }
    QAbstractButton::text(__return_storage_ptr__,this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QMessageBox::buttonText(int button) const
{
    Q_D(const QMessageBox);

    if (QAbstractButton *abstractButton = d->abstractButtonForId(button)) {
        return abstractButton->text();
    } else if (d->buttonBox->buttons().isEmpty() && (button == Ok || button == Old_Ok)) {
        // for compatibility with Qt 4.0/4.1
        return QDialogButtonBox::tr("OK");
    }
    return QString();
}